

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_2.h
# Opt level: O2

void __thiscall PlayerMike_2::~PlayerMike_2(PlayerMike_2 *this)

{
  ~PlayerMike_2(this);
  operator_delete(this);
  return;
}

Assistant:

PlayerMike_2(const std::string& name) :
      Player(name),
      m_histSize(2),
      m_predictMe(3),
      m_predictYou(3)
   {}